

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O1

void bitrv2(int n,int *ip,float *a)

{
  undefined8 uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  
  *ip = 0;
  if (n < 9) {
    uVar8 = 8;
    uVar12 = 1;
  }
  else {
    uVar3 = 1;
    do {
      n = (uint)n >> 1;
      if (0 < (int)uVar3) {
        uVar12 = 0;
        do {
          ip[uVar3 + uVar12] = ip[uVar12] + n;
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
      }
      uVar12 = (ulong)(uVar3 * 2);
      uVar8 = uVar3 * 0x10;
      uVar3 = uVar3 * 2;
    } while ((int)uVar8 < n);
  }
  iVar7 = (int)uVar12;
  uVar3 = iVar7 * 2;
  uVar4 = (ulong)uVar3;
  if (uVar8 == n) {
    if (0 < iVar7) {
      lVar5 = 0;
      uVar15 = 0;
      do {
        if (uVar15 != 0) {
          lVar13 = (long)ip[uVar15];
          lVar11 = lVar13 * 4 + uVar4 * 0xc;
          lVar2 = lVar13 * 4 + uVar4 * 8;
          lVar14 = 0;
          do {
            lVar10 = (long)*(int *)((long)ip + lVar14) + (long)((int)uVar15 * 2);
            uVar1 = *(undefined8 *)((long)a + lVar14 * 2 + lVar13 * 4);
            *(undefined8 *)((long)a + lVar14 * 2 + lVar13 * 4) = *(undefined8 *)(a + lVar10);
            *(undefined8 *)(a + lVar10) = uVar1;
            iVar9 = (int)lVar10 + iVar7 * 4;
            uVar1 = *(undefined8 *)((long)a + lVar14 * 2 + (uVar4 + lVar13) * 4);
            *(undefined8 *)((long)a + lVar14 * 2 + (uVar4 + lVar13) * 4) =
                 *(undefined8 *)(a + iVar9);
            *(undefined8 *)(a + iVar9) = uVar1;
            iVar9 = iVar9 + iVar7 * -2;
            uVar1 = *(undefined8 *)((long)a + lVar14 * 2 + lVar2);
            *(undefined8 *)((long)a + lVar14 * 2 + lVar2) = *(undefined8 *)(a + iVar9);
            *(undefined8 *)(a + iVar9) = uVar1;
            iVar9 = iVar9 + iVar7 * 4;
            uVar1 = *(undefined8 *)((long)a + lVar14 * 2 + lVar11);
            *(undefined8 *)((long)a + lVar14 * 2 + lVar11) = *(undefined8 *)(a + iVar9);
            *(undefined8 *)(a + iVar9) = uVar1;
            lVar14 = lVar14 + 4;
          } while (lVar5 != lVar14);
        }
        lVar11 = (long)((iVar7 + (int)uVar15) * 2) + (long)ip[uVar15];
        iVar9 = (int)lVar11 + uVar3;
        uVar1 = *(undefined8 *)(a + lVar11);
        *(undefined8 *)(a + lVar11) = *(undefined8 *)(a + iVar9);
        *(undefined8 *)(a + iVar9) = uVar1;
        uVar15 = uVar15 + 1;
        lVar5 = lVar5 + 4;
      } while (uVar15 != uVar12);
    }
  }
  else if (1 < iVar7) {
    uVar15 = 1;
    do {
      lVar5 = (long)ip[uVar15];
      uVar6 = 0;
      do {
        lVar11 = (long)ip[uVar6] + (long)((int)uVar15 * 2);
        uVar1 = *(undefined8 *)(a + lVar5 + uVar6 * 2);
        *(undefined8 *)(a + lVar5 + uVar6 * 2) = *(undefined8 *)(a + lVar11);
        *(undefined8 *)(a + lVar11) = uVar1;
        iVar7 = (int)lVar11 + uVar3;
        uVar1 = *(undefined8 *)(a + uVar4 + lVar5 + uVar6 * 2);
        *(undefined8 *)(a + uVar4 + lVar5 + uVar6 * 2) = *(undefined8 *)(a + iVar7);
        *(undefined8 *)(a + iVar7) = uVar1;
        uVar6 = uVar6 + 1;
      } while (uVar15 != uVar6);
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar12);
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, float *a)
{
    int j, j1, k, k1, l, m, m2;
    float xr, xi, yr, yi;

    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}